

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

time_point __thiscall absl::lts_20240722::ToChronoTime(lts_20240722 *this,Time t)

{
  undefined8 in_RAX;
  time_point tVar1;
  HiRep HVar2;
  Duration num;
  Duration DVar3;
  Duration DStack_10;
  undefined4 uStack_4;
  
  HVar2 = t.rep_.rep_hi_;
  if ((long)this < 0) {
    DStack_10.rep_hi_.lo_ = 0x10b7d1;
    DStack_10.rep_hi_.hi_ = 0;
    DVar3.rep_lo_ = t.rep_.rep_hi_.lo_;
    DVar3.rep_hi_ = (HiRep)this;
    uStack_4 = (int)((ulong)in_RAX >> 0x20);
    DVar3 = Floor(DVar3,(Duration)(ZEXT412(4) << 0x40));
    this = (lts_20240722 *)DVar3.rep_hi_;
    HVar2.hi_ = 0;
    HVar2.lo_ = DVar3.rep_lo_;
  }
  num.rep_lo_ = HVar2.lo_;
  if (num.rep_lo_ != 0xffffffff) {
    if ((ulong)this >> 0x21 != 0) {
      stack0xfffffffffffffff8 = CONCAT44(uStack_4,num.rep_lo_);
      num.rep_hi_ = (HiRep)this;
      DStack_10.rep_hi_ = (HiRep)this;
      tVar1.__d.__r = (duration)IDivDuration(num,(Duration)(ZEXT412(4) << 0x40),&DStack_10);
      return (time_point)tVar1.__d.__r;
    }
    return (time_point)(((ulong)HVar2 >> 2 & 0x3fffffff) + (long)this * 1000000000);
  }
  tVar1.__d.__r = (duration)-0x8000000000000000;
  if (-1 < (long)this) {
    tVar1.__d.__r = (duration)0x7fffffffffffffff;
  }
  return (time_point)tVar1.__d.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool operator<(Duration lhs,
                                                       Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}